

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

int __thiscall QTemporaryFileEngine::open(QTemporaryFileEngine *this,char *__file,int __oflag,...)

{
  byte bVar1;
  int iVar2;
  CreateUnnamedFileStatus CVar3;
  QFSFileEnginePrivate *pQVar4;
  long in_FS_OFFSET;
  CreateUnnamedFileStatus st;
  NativeFileHandle *file;
  QFSFileEnginePrivate *d;
  QSystemError error;
  QTemporaryFileName tfn;
  QFileSystemEntry *in_stack_fffffffffffffed8;
  QFileSystemEntry *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  QAbstractFileEngine *this_00;
  quint32 mode;
  QTemporaryFileName *tfn_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  quint32 in_stack_ffffffffffffff24;
  QTemporaryFileName *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  QTemporaryFileEngine *templateName;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  QTemporaryFileName local_90;
  undefined1 *local_68;
  uint local_58;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_54 [15];
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_54[0].i = (Int)__file;
  templateName = this;
  local_10 = ___oflag;
  pQVar4 = d_func((QTemporaryFileEngine *)0x2f7eaf);
  QFlags<QIODeviceBase::OpenModeFlag>::operator|=
            ((QFlags<QIODeviceBase::OpenModeFlag> *)local_54,ReadWrite);
  if ((this->filePathIsTemplate & 1U) == 0) {
    local_58 = local_54[0].i;
    local_18 = local_10;
    iVar2 = QFSFileEngine::open(&this->super_QFSFileEngine,(char *)(ulong)local_54[0].i,
                                (int)local_10);
    bVar1 = (byte)iVar2 & 1;
    goto LAB_002f8181;
  }
  this_00 = (QAbstractFileEngine *)&DAT_aaaaaaaaaaaaaaaa;
  local_90.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_90.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_90.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_90.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  mode = (quint32)((ulong)&local_90.path.d.ptr >> 0x20);
  QTemporaryFileName::QTemporaryFileName
            ((QTemporaryFileName *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (QString *)templateName);
  tfn_00 = &local_90;
  local_90.path.d.d = (Data *)this_00;
  QSystemError::QSystemError((QSystemError *)tfn_00);
  CVar3 = createUnnamedFile((NativeFileHandle *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),tfn_00,
                            mode,(QSystemError *)this_00);
  if (CVar3 == Success) {
    this->unnamedFile = true;
    QFileSystemEntry::clear(in_stack_fffffffffffffee0);
LAB_002f8118:
    pQVar4->closeFileHandle = true;
    (pQVar4->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
    super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = local_54[0].i;
    pQVar4->lastFlushFailed = false;
    pQVar4->field_0xc2 = pQVar4->field_0xc2 & 0xfb;
    bVar1 = 1;
  }
  else {
    if ((CVar3 == NotSupported) &&
       (in_stack_fffffffffffffeef =
             createFileFromTemplate
                       ((NativeFileHandle *)CONCAT44(1,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                        in_stack_ffffffffffffff20,
                        (QSystemError *)
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)),
       (bool)in_stack_fffffffffffffeef)) {
      this->filePathIsTemplate = false;
      this->unnamedFile = false;
      QFileSystemEntry::QFileSystemEntry
                ((QFileSystemEntry *)
                 CONCAT17(in_stack_fffffffffffffeef,
                          CONCAT16(in_stack_fffffffffffffeee,
                                   CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))),
                 (NativePath *)in_stack_fffffffffffffee0,SUB81((ulong)this_00 >> 0x38,0));
      QFileSystemEntry::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      QFileSystemEntry::~QFileSystemEntry(in_stack_fffffffffffffee0);
      goto LAB_002f8118;
    }
    QSystemError::toString((QSystemError *)in_stack_fffffffffffffed8);
    QAbstractFileEngine::setError
              (this_00,CONCAT13(in_stack_fffffffffffffeef,
                                CONCAT12(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec)),
               &in_stack_fffffffffffffee0->m_filePath);
    QString::~QString((QString *)0x2f80e6);
    bVar1 = 0;
  }
  QTemporaryFileName::~QTemporaryFileName((QTemporaryFileName *)0x2f8170);
LAB_002f8181:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),bVar1) & 0xffffff01;
}

Assistant:

bool QTemporaryFileEngine::open(QIODevice::OpenMode openMode,
                                std::optional<QFile::Permissions> permissions)
{
    Q_D(QFSFileEngine);
    Q_ASSERT(!isReallyOpen());

    openMode |= QIODevice::ReadWrite;

    if (!filePathIsTemplate)
        return QFSFileEngine::open(openMode, permissions);

    QTemporaryFileName tfn(templateName);

    QSystemError error;
#if defined(Q_OS_WIN)
    NativeFileHandle &file = d->fileHandle;
#else // POSIX
    NativeFileHandle &file = d->fd;
#endif

    CreateUnnamedFileStatus st = createUnnamedFile(file, tfn, fileMode, &error);
    if (st == CreateUnnamedFileStatus::Success) {
        unnamedFile = true;
        d->fileEntry.clear();
    } else if (st == CreateUnnamedFileStatus::NotSupported &&
               createFileFromTemplate(file, tfn, fileMode, flags, error)) {
        filePathIsTemplate = false;
        unnamedFile = false;
        d->fileEntry = QFileSystemEntry(tfn.path, QFileSystemEntry::FromNativePath());
    } else {
        setError(QFile::OpenError, error.toString());
        return false;
    }

#if !defined(Q_OS_WIN)
    d->closeFileHandle = true;
#endif

    d->openMode = openMode;
    d->lastFlushFailed = false;
    d->tried_stat = 0;

    return true;
}